

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

StringPtr __thiscall
capnp::compiler::Compiler::Node::joinDisplayName
          (Node *this,Arena *arena,Node *parent,StringPtr declName)

{
  ChunkHeader *pCVar1;
  char cVar2;
  char *__dest;
  ArrayPtr<char> AVar3;
  StringPtr SVar4;
  
  AVar3 = kj::Arena::allocateArray<char>
                    ((Arena *)this,(size_t)(declName.content.ptr + (long)arena[2].currentChunk));
  __dest = AVar3.ptr;
  pCVar1 = arena[2].currentChunk;
  memcpy(__dest,arena[2].objectList,(size_t)((long)&pCVar1[-1].end + 7));
  cVar2 = '.';
  if (arena->objectList == (ObjectHeader *)0x0) {
    cVar2 = ':';
  }
  (__dest + -1)[(long)pCVar1] = cVar2;
  memcpy(__dest + (long)&pCVar1->next,parent,(size_t)(declName.content.ptr + -1));
  __dest[AVar3.size_ - 1] = '\0';
  SVar4.content.ptr = AVar3.ptr;
  SVar4.content.size_ = AVar3.size_;
  return (StringPtr)SVar4.content;
}

Assistant:

kj::StringPtr Compiler::Node::joinDisplayName(
    kj::Arena& arena, Node& parent, kj::StringPtr declName) {
  kj::ArrayPtr<char> result = arena.allocateArray<char>(
      parent.displayName.size() + declName.size() + 2);

  size_t separatorPos = parent.displayName.size();
  memcpy(result.begin(), parent.displayName.begin(), separatorPos);
  result[separatorPos] = parent.parent == kj::none ? ':' : '.';
  memcpy(result.begin() + separatorPos + 1, declName.begin(), declName.size());
  result[result.size() - 1] = '\0';
  return kj::StringPtr(result.begin(), result.size() - 1);
}